

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_adjust_idle_stream(nghttp2_session *session)

{
  nghttp2_stream *pnVar1;
  uint uVar2;
  int iVar3;
  nghttp2_stream **ppnVar4;
  ulong uVar5;
  uint uVar6;
  nghttp2_stream *stream;
  ulong uVar7;
  
  uVar2 = (session->local_settings).max_concurrent_streams;
  uVar6 = session->pending_local_max_concurrent_stream;
  if (uVar2 < session->pending_local_max_concurrent_stream) {
    uVar6 = uVar2;
  }
  uVar2 = 0x10;
  if (0x10 < uVar6) {
    uVar2 = uVar6;
  }
  uVar7 = 100;
  if (uVar2 < 100) {
    uVar7 = (ulong)uVar2;
  }
  if (uVar7 < session->num_idle_streams) {
    stream = session->idle_stream_head;
    do {
      if (stream == (nghttp2_stream *)0x0) {
        __assert_fail("head",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                      ,0x6ad,"int nghttp2_session_adjust_idle_stream(nghttp2_session *)");
      }
      pnVar1 = stream->closed_next;
      iVar3 = nghttp2_session_destroy_stream(session,stream);
      if (iVar3 != 0) {
        return iVar3;
      }
      session->idle_stream_head = pnVar1;
      ppnVar4 = &pnVar1->closed_prev;
      if (pnVar1 == (nghttp2_stream *)0x0) {
        ppnVar4 = &session->idle_stream_tail;
      }
      *ppnVar4 = (nghttp2_stream *)0x0;
      uVar5 = session->num_idle_streams - 1;
      session->num_idle_streams = uVar5;
      stream = pnVar1;
    } while (uVar7 < uVar5);
  }
  return 0;
}

Assistant:

int nghttp2_session_adjust_idle_stream(nghttp2_session *session) {
  size_t max;
  int rv;

  /* Make minimum number of idle streams 16, and maximum 100, which
     are arbitrary chosen numbers. */
  max = nghttp2_min_uint32(
    100,
    nghttp2_max_uint32(
      16, nghttp2_min_uint32(session->local_settings.max_concurrent_streams,
                             session->pending_local_max_concurrent_stream)));

  DEBUGF("stream: adjusting kept idle streams num_idle_streams=%zu, max=%zu\n",
         session->num_idle_streams, max);

  while (session->num_idle_streams > max) {
    nghttp2_stream *head;
    nghttp2_stream *next;

    head = session->idle_stream_head;
    assert(head);

    next = head->closed_next;

    rv = nghttp2_session_destroy_stream(session, head);
    if (rv != 0) {
      return rv;
    }

    /* head is now destroyed */

    session->idle_stream_head = next;

    if (session->idle_stream_head) {
      session->idle_stream_head->closed_prev = NULL;
    } else {
      session->idle_stream_tail = NULL;
    }

    --session->num_idle_streams;
  }

  return 0;
}